

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

fdb_status fdb_get_kvs_name_list(fdb_file_handle *fhandle,fdb_kvs_name_list *kvs_name_list)

{
  long lVar1;
  avl_node *paVar2;
  size_t sVar3;
  undefined8 *puVar4;
  char *__dest;
  long *in_RSI;
  long *in_RDI;
  avl_node *a;
  kvs_node *node;
  kvs_header *kv_header;
  fdb_kvs_handle *root_handle;
  char **segment;
  char *ptr;
  size_t offset;
  size_t size;
  size_t num;
  avl_node *local_60;
  long local_30;
  long local_28;
  long local_20;
  fdb_status local_4;
  
  if (in_RDI == (long *)0x0) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else if (in_RSI == (long *)0x0) {
    local_4 = FDB_RESULT_INVALID_ARGS;
  }
  else {
    lVar1 = *(long *)(*(long *)(*in_RDI + 0x48) + 0x170);
    pthread_spin_lock((pthread_spinlock_t *)(lVar1 + 0x38));
    local_20 = 1;
    sVar3 = strlen(default_kvs_name);
    local_28 = sVar3 + 1;
    local_60 = avl_first(*(avl_tree **)(lVar1 + 0x20));
    while (local_60 != (avl_node *)0x0) {
      paVar2 = local_60 + -8;
      local_60 = avl_next(local_60);
      local_20 = local_20 + 1;
      sVar3 = strlen((char *)paVar2->left);
      local_28 = sVar3 + 1 + local_28;
    }
    puVar4 = (undefined8 *)calloc(1,local_20 * 8 + local_28);
    *in_RSI = local_20;
    in_RSI[1] = (long)puVar4;
    __dest = (char *)(puVar4 + local_20);
    strcpy(__dest,default_kvs_name);
    *puVar4 = __dest;
    local_20 = 1;
    sVar3 = strlen(default_kvs_name);
    local_30 = sVar3 + 1;
    local_60 = avl_first(*(avl_tree **)(lVar1 + 0x18));
    while (local_60 != (avl_node *)0x0) {
      paVar2 = local_60 + -7;
      local_60 = avl_next(local_60);
      strcpy(__dest + local_30,(char *)paVar2->left);
      puVar4[local_20] = __dest + local_30;
      local_20 = local_20 + 1;
      sVar3 = strlen((char *)paVar2->left);
      local_30 = sVar3 + 1 + local_30;
    }
    pthread_spin_unlock((pthread_spinlock_t *)(lVar1 + 0x38));
    local_4 = FDB_RESULT_SUCCESS;
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_kvs_name_list(fdb_file_handle *fhandle,
                                 fdb_kvs_name_list *kvs_name_list)
{
    size_t num, size, offset;
    char *ptr;
    char **segment;
    fdb_kvs_handle *root_handle;
    struct kvs_header *kv_header;
    struct kvs_node *node;
    struct avl_node *a;

    if (!fhandle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!kvs_name_list) {
        return FDB_RESULT_INVALID_ARGS;
    }

    root_handle = fhandle->root;
    kv_header = root_handle->file->kv_header;

    spin_lock(&kv_header->lock);
    // sum all lengths of KVS names first
    // (to calculate the size of memory segment to be allocated)
    num = 1;
    size = strlen(default_kvs_name) + 1;
    a = avl_first(kv_header->idx_id);
    while (a) {
        node = _get_entry(a, struct kvs_node, avl_id);
        a = avl_next(&node->avl_id);

        num++;
        size += strlen(node->kvs_name) + 1;
    }
    size += num * sizeof(char*);

    // allocate memory segment
    segment = (char**)calloc(1, size);
    kvs_name_list->num_kvs_names = num;
    kvs_name_list->kvs_names = segment;

    ptr = (char*)segment + num * sizeof(char*);
    offset = num = 0;

    // copy default KVS name
    strcpy(ptr + offset, default_kvs_name);
    segment[num] = ptr + offset;
    num++;
    offset += strlen(default_kvs_name) + 1;

    // copy the others
    a = avl_first(kv_header->idx_name);
    while (a) {
        node = _get_entry(a, struct kvs_node, avl_name);
        a = avl_next(&node->avl_name);

        strcpy(ptr + offset, node->kvs_name);
        segment[num] = ptr + offset;

        num++;
        offset += strlen(node->kvs_name) + 1;
    }

    spin_unlock(&kv_header->lock);

    return FDB_RESULT_SUCCESS;
}